

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

bool __thiscall
duckdb::ART::SearchEqual(ART *this,ARTKey *key,idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  bool bVar1;
  unsafe_optional_ptr<const_Node> node;
  ARTKey empty_key;
  Iterator it;
  ARTKey local_c0;
  Iterator local_b0;
  
  node = Lookup(this,&this->tree,key,0);
  if (node.ptr == (Node *)0x0) {
    bVar1 = true;
  }
  else {
    Iterator::Iterator(&local_b0,this);
    Iterator::FindMinimum(&local_b0,node.ptr);
    ARTKey::ARTKey(&local_c0);
    bVar1 = Iterator::Scan(&local_b0,&local_c0,max_count,row_ids,false);
    ::std::_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::~_Deque_base
              ((_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_> *)
               &local_b0.nodes);
    if (local_b0.current_key.key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.current_key.key_bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool ART::SearchEqual(ARTKey &key, idx_t max_count, unsafe_vector<row_t> &row_ids) {
	auto leaf = Lookup(tree, key, 0);
	if (!leaf) {
		return true;
	}

	Iterator it(*this);
	it.FindMinimum(*leaf);
	ARTKey empty_key = ARTKey();
	return it.Scan(empty_key, max_count, row_ids, false);
}